

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token.cpp
# Opt level: O3

bool __thiscall Tokens::IsReservada(Tokens *this,string *palavra)

{
  int iVar1;
  char *__dest;
  iterator __position;
  int local_1c;
  
  __dest = (char *)operator_new__(palavra->_M_string_length + 1);
  strcpy(__dest,(palavra->_M_dataplus)._M_p);
  iVar1 = strcasecmp(__dest,"program");
  if (iVar1 == 0) {
    local_1c = 0x27;
    __position._M_current =
         (this->Token).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
         ._M_finish;
    if (__position._M_current ==
        (this->Token).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage) goto LAB_00103afc;
    *__position._M_current = 0x27;
  }
  else {
    iVar1 = strcasecmp(__dest,"var");
    if (iVar1 == 0) {
      local_1c = 0x28;
      __position._M_current =
           (this->Token).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->Token).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) goto LAB_00103afc;
      *__position._M_current = 0x28;
    }
    else {
      iVar1 = strcasecmp(__dest,"integer");
      if (iVar1 == 0) {
        local_1c = 0x25;
        __position._M_current =
             (this->Token).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (this->Token).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) goto LAB_00103afc;
        *__position._M_current = 0x25;
      }
      else {
        iVar1 = strcasecmp(__dest,"begin");
        if (iVar1 == 0) {
          local_1c = 0x22;
          __position._M_current =
               (this->Token).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (__position._M_current ==
              (this->Token).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) goto LAB_00103afc;
          *__position._M_current = 0x22;
        }
        else {
          iVar1 = strcasecmp(__dest,"end");
          if (iVar1 == 0) {
            local_1c = 0x2b;
            __position._M_current =
                 (this->Token).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (__position._M_current ==
                (this->Token).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) goto LAB_00103afc;
            *__position._M_current = 0x2b;
          }
          else {
            iVar1 = strcasecmp(__dest,"function");
            if (iVar1 == 0) {
              local_1c = 0x23;
              __position._M_current =
                   (this->Token).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish;
              if (__position._M_current ==
                  (this->Token).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) goto LAB_00103afc;
              *__position._M_current = 0x23;
            }
            else {
              iVar1 = strcasecmp(__dest,"procedure");
              if (iVar1 != 0) {
                iVar1 = strcasecmp(__dest,"if");
                if (iVar1 == 0) {
                  iVar1 = 0x1f;
                }
                else {
                  iVar1 = strcasecmp(__dest,"then");
                  if (iVar1 == 0) {
                    iVar1 = 0x20;
                  }
                  else {
                    iVar1 = strcasecmp(__dest,"else");
                    if (iVar1 == 0) {
                      iVar1 = 0x21;
                    }
                    else {
                      iVar1 = strcasecmp(__dest,"while");
                      if (iVar1 == 0) {
                        iVar1 = 0x29;
                      }
                      else {
                        iVar1 = strcasecmp(__dest,"do");
                        if (iVar1 != 0) {
                          return false;
                        }
                        iVar1 = 0x2a;
                      }
                    }
                  }
                }
                setToken(this,iVar1);
                return true;
              }
              local_1c = 0x26;
              __position._M_current =
                   (this->Token).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish;
              if (__position._M_current ==
                  (this->Token).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
LAB_00103afc:
                std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                          ((vector<int,std::allocator<int>> *)this,__position,&local_1c);
                return true;
              }
              *__position._M_current = 0x26;
            }
          }
        }
      }
    }
  }
  (this->Token).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = __position._M_current + 1;
  return true;
}

Assistant:

bool Tokens::IsReservada (string palavra){
  char *lower;
  lower = new char[palavra.size()+1];
  strcpy (lower, palavra.c_str());
  if (strcasecmp(lower,"program") == 0) {
    setToken (PROGRAM);
    return true;
  }
  if (strcasecmp(lower, "var") == 0) {
    setToken (VAR);
    return true;
  }
  if (strcasecmp(lower,"integer") == 0) {
    setToken (INTEGER);
    return true;
  }
  if (strcasecmp(lower,"begin") == 0) {
    setToken (BEGIN);
    return true;
  }
  if (strcasecmp(lower,"end") == 0) {
    setToken (END);
    return true;
  }
  if (strcasecmp(lower,"function") == 0) {
    setToken (FUNCTION);
    return true;
  }
  if (strcasecmp(lower,"procedure") == 0) {
    setToken (PROCEDURE);
    return true;
  }
  if (strcasecmp(lower,"if") == 0) {
    setToken (IF);
    return true;
  }
  if (strcasecmp(lower,"then") == 0) {
    setToken (THEN);
    return true;
  }
  if (strcasecmp(lower,"else") == 0) {
    setToken (ELSE);
    return true;
  }
  if (strcasecmp(lower,"while") == 0) {
    setToken (WHILE);
    return true;
  }
  if (strcasecmp(lower, "do") == 0) {
    setToken (DO);
    return true;
  }
  return false;
}